

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataMaterials
          (MeshGeometry *this,vector<int,_std::allocator<int>_> *materials_out,Scope *source,
          string *MappingInformationType,string *ReferenceInformationType)

{
  value_type vVar1;
  pointer puVar2;
  pointer puVar3;
  pointer piVar4;
  pointer piVar5;
  value_type *pvVar6;
  string *psVar7;
  bool bVar8;
  Element *el;
  reference pvVar9;
  value_type *pvVar10;
  allocator local_1b1;
  string *local_1b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  puVar2 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 == puVar3) {
    return;
  }
  local_1b0 = ReferenceInformationType;
  std::__cxx11::string::string((string *)&local_1a8,"Materials",&local_1b1);
  el = GetRequiredElement(source,(string *)&local_1a8,(Element *)0x0);
  ParseVectorDataArray(materials_out,el);
  std::__cxx11::string::~string((string *)&local_1a8);
  bVar8 = std::operator==(MappingInformationType,"AllSame");
  if (bVar8) {
    piVar4 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar4 != piVar5) {
      if (4 < (ulong)((long)piVar5 - (long)piVar4)) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[73]>
                  (&local_1a8,
                   (char (*) [73])
                   "expected only a single material index, ignoring all except the first one");
        LogFunctions<Assimp::FBXImporter>::LogWarn(&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        piVar4 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish != piVar4) {
          (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = piVar4;
        }
      }
      std::vector<int,_std::allocator<int>_>::resize
                (materials_out,
                 ((long)(this->m_vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_vertices).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0xc);
      pvVar10 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pvVar6 = (materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pvVar9 = std::vector<int,_std::allocator<int>_>::at(materials_out,0);
      vVar1 = *pvVar9;
      for (; pvVar10 != pvVar6; pvVar10 = pvVar10 + 1) {
        *pvVar10 = vVar1;
      }
      return;
    }
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[34]>(&local_1a8,(char (*) [34])"expected material index, ignoring");
    LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
  }
  else {
    bVar8 = std::operator==(MappingInformationType,"ByPolygon");
    psVar7 = local_1b0;
    if ((bVar8) && (bVar8 = std::operator==(local_1b0,"IndexToDirect"), bVar8)) {
      std::vector<int,_std::allocator<int>_>::resize(materials_out,(long)puVar2 - (long)puVar3 >> 2)
      ;
      if ((long)(materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(materials_out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start == (long)puVar2 - (long)puVar3) {
        return;
      }
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[56]>
                (&local_1a8,(char (*) [56])"length of input data unexpected for ByPolygon mapping: "
                );
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::operator<<((ostream *)&local_1a8,", expected ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
    }
    else {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[61]>
                (&local_1a8,
                 (char (*) [61])"ignoring material assignments, access type not implemented: ");
      std::operator<<((ostream *)&local_1a8,(string *)MappingInformationType);
      std::operator<<((ostream *)&local_1a8,",");
      std::operator<<((ostream *)&local_1a8,(string *)psVar7);
      LogFunctions<Assimp::FBXImporter>::LogError(&local_1a8);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataMaterials(std::vector<int>& materials_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    const size_t face_count = m_faces.size();
    if( 0 == face_count )
    {
        return;
    }
    
    // materials are handled separately. First of all, they are assigned per-face
    // and not per polyvert. Secondly, ReferenceInformationType=IndexToDirect
    // has a slightly different meaning for materials.
    ParseVectorDataArray(materials_out,GetRequiredElement(source,"Materials"));

    if (MappingInformationType == "AllSame") {
        // easy - same material for all faces
        if (materials_out.empty()) {
            FBXImporter::LogError(Formatter::format("expected material index, ignoring"));
            return;
        } else if (materials_out.size() > 1) {
            FBXImporter::LogWarn(Formatter::format("expected only a single material index, ignoring all except the first one"));
            materials_out.clear();
        }

        materials_out.resize(m_vertices.size());
        std::fill(materials_out.begin(), materials_out.end(), materials_out.at(0));
    } else if (MappingInformationType == "ByPolygon" && ReferenceInformationType == "IndexToDirect") {
        materials_out.resize(face_count);

        if(materials_out.size() != face_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
                << materials_out.size() << ", expected " << face_count
            );
            return;
        }
    } else {
        FBXImporter::LogError(Formatter::format("ignoring material assignments, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}